

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.c
# Opt level: O0

int exr_compression_lines_per_chunk(exr_compression_t comptype)

{
  int linePerChunk;
  exr_compression_t comptype_local;
  
  linePerChunk = -1;
  switch(comptype) {
  case EXR_COMPRESSION_NONE:
  case EXR_COMPRESSION_RLE:
  case EXR_COMPRESSION_ZIPS:
    linePerChunk = 1;
    break;
  case EXR_COMPRESSION_ZIP:
  case EXR_COMPRESSION_PXR24:
    linePerChunk = 0x10;
    break;
  case EXR_COMPRESSION_PIZ:
  case EXR_COMPRESSION_B44:
  case EXR_COMPRESSION_B44A:
  case EXR_COMPRESSION_DWAA:
    linePerChunk = 0x20;
    break;
  case EXR_COMPRESSION_DWAB:
    linePerChunk = 0x100;
    break;
  case EXR_COMPRESSION_LAST_TYPE:
  }
  return linePerChunk;
}

Assistant:

int exr_compression_lines_per_chunk (exr_compression_t comptype)
{
    int linePerChunk = -1;

    switch (comptype)
    {
        case EXR_COMPRESSION_NONE:
        case EXR_COMPRESSION_RLE:
        case EXR_COMPRESSION_ZIPS: linePerChunk = 1; break;
        case EXR_COMPRESSION_ZIP:
        case EXR_COMPRESSION_PXR24: linePerChunk = 16; break;
        case EXR_COMPRESSION_PIZ:
        case EXR_COMPRESSION_B44:
        case EXR_COMPRESSION_B44A:
        case EXR_COMPRESSION_DWAA: linePerChunk = 32; break;
        case EXR_COMPRESSION_DWAB: linePerChunk = 256; break;
        case EXR_COMPRESSION_LAST_TYPE:
        default:
            /* ERROR CONDITION */
            break;
    }
    return linePerChunk;
}